

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuregistrarproxy_p.h
# Opt level: O0

QDBusReply<QString> * __thiscall
QDBusMenuRegistrarInterface::GetMenuForWindow
          (QDBusMenuRegistrarInterface *this,uint windowId,QDBusObjectPath *menuObjectPath)

{
  int iVar1;
  qsizetype qVar2;
  QDBusReply<QString> *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  QList<QVariant> arguments;
  QDBusMessage reply;
  DataPointer *in_stack_ffffffffffffff38;
  QDBusMessage *reply_00;
  QDBusReply<QString> *v;
  QDBusReply<QString> *args;
  char16_t *method;
  CallMode mode;
  QArrayDataPointer<char16_t> *this_00;
  QList<QVariant> local_60;
  QArrayDataPointer<char16_t> local_48 [2];
  undefined1 *local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18[0] = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = local_48;
  mode = NoBlock;
  method = L"GetMenuForWindow";
  v = in_RDI;
  args = in_RDI;
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"GetMenuForWindow",0x10);
  QString::QString((QString *)in_RDI,in_stack_ffffffffffffff38);
  QDBusAbstractInterface::call<unsigned_int&>
            ((QDBusAbstractInterface *)this_00,mode,(QString *)method,(uint *)args);
  QString::~QString((QString *)0xaf42bf);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)in_RDI);
  local_60.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_60.d.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  local_60.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QDBusMessage::arguments();
  iVar1 = QDBusMessage::type();
  if (iVar1 == 2) {
    qVar2 = QList<QVariant>::size(&local_60);
    if (qVar2 == 2) {
      QList<QVariant>::at((QList<QVariant> *)in_RDI,(qsizetype)in_stack_ffffffffffffff38);
      qdbus_cast<QDBusObjectPath>((QVariant *)v);
      QDBusObjectPath::operator=
                ((QDBusObjectPath *)in_RDI,(QDBusObjectPath *)in_stack_ffffffffffffff38);
      QDBusObjectPath::~QDBusObjectPath((QDBusObjectPath *)0xaf4359);
    }
  }
  reply_00 = (QDBusMessage *)local_18;
  QDBusReply<QString>::QDBusReply(in_RDI,reply_00);
  QList<QVariant>::~QList((QList<QVariant> *)0xaf4379);
  QDBusMessage::~QDBusMessage(reply_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return v;
  }
  __stack_chk_fail();
}

Assistant:

QDBusReply<QString> GetMenuForWindow(uint windowId, QDBusObjectPath &menuObjectPath)
    {
        QDBusMessage reply = call(QDBus::Block, QStringLiteral("GetMenuForWindow"), windowId);
        QList<QVariant> arguments = reply.arguments();
        if (reply.type() == QDBusMessage::ReplyMessage && arguments.size() == 2)
            menuObjectPath = qdbus_cast<QDBusObjectPath>(arguments.at(1));
        return reply;
    }